

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

void stbtt_Rasterize(stbtt__bitmap *result,float flatness_in_pixels,stbtt_vertex *vertices,
                    int num_verts,float scale_x,float scale_y,float shift_x,float shift_y,int x_off,
                    int y_off,int invert,void *userdata)

{
  uchar uVar1;
  uint uVar2;
  stbtt__active_edge *z;
  stbtt__point *points;
  float *pfVar3;
  stbtt__active_edge *psVar4;
  stbtt__active_edge *psVar5;
  undefined8 *puVar6;
  ulong uVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  stbtt__active_edge *psVar14;
  undefined1 uVar15;
  undefined8 uVar16;
  undefined8 *puVar17;
  undefined1 auVar18 [8];
  int iVar19;
  stbtt__edge *psVar20;
  stbtt__point *psVar21;
  undefined4 in_register_00000084;
  stbtt__edge *psVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  int iVar26;
  void *p;
  int iVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float in_XMM2_Db;
  float in_XMM2_Dc;
  float in_XMM2_Dd;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  ulong local_308;
  int local_300;
  stbtt__edge *local_f8;
  float *local_f0;
  undefined1 local_e8 [16];
  float local_d4;
  stbtt__point *local_d0;
  undefined8 *local_c8;
  stbtt__point *local_c0;
  float *local_b8;
  ulong local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  stbtt__active_edge *active;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_74;
  float local_70;
  int local_6c;
  stbtt__edge *local_68;
  int local_5c;
  stbtt__active_edge *local_58;
  float *local_50;
  undefined8 local_48;
  float local_40;
  float local_3c;
  float local_38;
  float y0;
  
  local_b0 = CONCAT44(in_register_00000084,y_off);
  local_a8._0_4_ = invert;
  local_50 = (float *)CONCAT44(local_50._4_4_,shift_y);
  if (0 < num_verts) {
    fVar28 = scale_y;
    if (scale_x <= scale_y) {
      fVar28 = scale_x;
    }
    local_40 = (flatness_in_pixels / fVar28) * (flatness_in_pixels / fVar28);
    lVar11 = 0;
    uVar2 = 0;
    do {
      uVar2 = uVar2 + ((&vertices->type)[lVar11] == '\x01');
      lVar11 = lVar11 + 10;
    } while ((ulong)(uint)num_verts * 10 != lVar11);
    if (uVar2 != 0) {
      local_e8._8_8_ = local_e8._0_8_;
      local_e8._0_8_ = CONCAT44(0,uVar2);
      local_88 = scale_y;
      fStack_84 = in_XMM2_Db;
      fStack_80 = in_XMM2_Dc;
      fStack_7c = in_XMM2_Dd;
      local_74 = (float)x_off;
      local_38 = scale_x;
      y0 = shift_x;
      local_d0 = (stbtt__point *)malloc(CONCAT44(0,uVar2) * 4);
      if (local_d0 != (stbtt__point *)0x0) {
        uVar16 = CONCAT71((int7)((ulong)result >> 8),1);
        bVar8 = false;
        local_48 = (float *)((ulong)local_48._4_4_ << 0x20);
        points = (stbtt__point *)0x0;
        fVar28 = 0.0;
        active = (stbtt__active_edge *)result;
        do {
          psVar21 = local_d0;
          if ((bVar8) &&
             (points = (stbtt__point *)malloc((long)(int)fVar28 << 3), points == (stbtt__point *)0x0
             )) goto LAB_0010b3c1;
          local_3c = (float)uVar16;
          local_308 = local_308 & 0xffffffff00000000;
          uVar2 = 0xffffffff;
          fVar30 = 0.0;
          lVar11 = 0;
          fVar28 = 0.0;
          do {
            uVar1 = (&vertices->type)[lVar11];
            if (uVar1 == '\x03') {
              stbtt__tesselate_curve
                        (points,(int *)&local_308,fVar28,fVar30,
                         (float)(int)*(short *)((long)&vertices->cx + lVar11),
                         (float)(int)*(short *)((long)&vertices->cy + lVar11),
                         (float)(int)*(short *)((long)&vertices->x + lVar11),
                         (float)(int)*(short *)((long)&vertices->y + lVar11),local_40,0);
              fVar28 = (float)(int)*(short *)((long)&vertices->x + lVar11);
              fVar30 = (float)(int)*(short *)((long)&vertices->y + lVar11);
            }
            else {
              fVar29 = (float)local_308;
              if (uVar1 == '\x02') {
                fVar28 = (float)(int)*(short *)((long)&vertices->x + lVar11);
                fVar30 = (float)(int)*(short *)((long)&vertices->y + lVar11);
                lVar12 = (long)(int)(float)local_308;
                local_308 = CONCAT44(local_308._4_4_,(int)(float)local_308 + 1);
                if (points != (stbtt__point *)0x0) {
                  points[lVar12].x = fVar28;
                  points[lVar12].y = fVar30;
                }
              }
              else if (uVar1 == '\x01') {
                if (-1 < (int)uVar2) {
                  (&local_d0->x)[uVar2] = (float)((int)(float)local_308 - (int)(float)local_48);
                }
                fVar28 = (float)(int)*(short *)((long)&vertices->x + lVar11);
                fVar30 = (float)(int)*(short *)((long)&vertices->y + lVar11);
                uVar2 = uVar2 + 1;
                local_308 = CONCAT44(local_308._4_4_,(int)(float)local_308 + 1);
                if (points != (stbtt__point *)0x0) {
                  points[(int)fVar29].x = fVar28;
                  points[(int)fVar29].y = fVar30;
                }
                local_48 = (float *)CONCAT44(local_48._4_4_,fVar29);
              }
            }
            psVar14 = active;
            psVar21 = local_d0;
            lVar11 = lVar11 + 10;
          } while ((ulong)(uint)num_verts * 10 != lVar11);
          (&local_d0->x)[(int)uVar2] = (float)((int)(float)local_308 - (int)(float)local_48);
          bVar8 = true;
          uVar16 = 0;
          fVar28 = (float)local_308;
        } while (((uint)local_3c & 1) != 0);
        if (points != (stbtt__point *)0x0) {
          lVar12 = 0;
          lVar11 = 0;
          do {
            lVar11 = (long)(int)lVar11 + (long)(int)(&local_d0->x)[lVar12];
            lVar12 = lVar12 + 1;
          } while (local_e8._0_8_ != lVar12);
          pfVar3 = (float *)&local_308;
          if (local_a8._0_4_ != 0) {
            local_88 = -local_88;
            fStack_84 = -fStack_84;
            fStack_80 = -fStack_80;
            fStack_7c = -fStack_7c;
          }
          local_c0 = points;
          local_68 = (stbtt__edge *)malloc(lVar11 * 0x14 + 0x14);
          if (local_68 != (stbtt__edge *)0x0) {
            local_48 = &local_c0->y;
            lVar11 = 0;
            uVar2 = 0;
            iVar19 = 0;
            do {
              fVar28 = (&psVar21->x)[lVar11];
              if (0 < (long)(int)fVar28) {
                lVar12 = (long)iVar19;
                lVar23 = 0;
                iVar27 = (int)fVar28 + -1;
                do {
                  lVar25 = (long)iVar27;
                  fVar30 = local_c0[lVar12 + lVar25].y;
                  fVar29 = local_48[lVar12 * 2 + lVar23 * 2];
                  iVar26 = (int)lVar23;
                  if ((fVar30 != fVar29) || (NAN(fVar30) || NAN(fVar29))) {
                    psVar20 = local_68 + (int)uVar2;
                    local_68[(int)uVar2].invert = 0;
                    iVar24 = iVar26;
                    if (local_a8._0_4_ == 0) {
                      if (fVar30 < fVar29) goto LAB_0010a87f;
                    }
                    else if (fVar29 < fVar30) {
LAB_0010a87f:
                      psVar20->invert = 1;
                      lVar25 = lVar23;
                      iVar24 = iVar27;
                    }
                    psVar20->x0 = local_c0[lVar12 + iVar24].x * local_38 + y0;
                    psVar20->y0 = local_c0[lVar12 + iVar24].y * local_88 + local_50._0_4_;
                    psVar20->x1 = local_c0[lVar12 + lVar25].x * local_38 + y0;
                    psVar20->y1 = local_c0[lVar12 + lVar25].y * local_88 + local_50._0_4_;
                    uVar2 = uVar2 + 1;
                    psVar14 = active;
                  }
                  lVar23 = lVar23 + 1;
                  iVar27 = iVar26;
                } while ((int)fVar28 != lVar23);
              }
              iVar19 = (int)fVar28 + iVar19;
              lVar11 = lVar11 + 1;
            } while (lVar11 != local_e8._0_8_);
            stbtt__sort_edges_quicksort(local_68,uVar2);
            if (1 < (int)uVar2) {
              uVar13 = 1;
              lVar11 = 2;
              psVar20 = local_68;
              do {
                fVar28 = local_68[uVar13].x0;
                fVar30 = local_68[uVar13].y0;
                local_300 = local_68[uVar13].invert;
                local_308._0_4_ = local_68[uVar13].x1;
                local_308._4_4_ = local_68[uVar13].y1;
                lVar12 = lVar11;
                psVar22 = psVar20;
                do {
                  if (psVar22->y0 <= fVar30) {
                    uVar9 = (int)lVar12 - 1;
                    goto LAB_0010a9a1;
                  }
                  psVar22[1].invert = psVar22->invert;
                  fVar29 = psVar22->y0;
                  fVar33 = psVar22->x1;
                  fVar31 = psVar22->y1;
                  psVar22[1].x0 = psVar22->x0;
                  psVar22[1].y0 = fVar29;
                  psVar22[1].x1 = fVar33;
                  psVar22[1].y1 = fVar31;
                  lVar12 = lVar12 + -1;
                  psVar22 = psVar22 + -1;
                } while (1 < lVar12);
                uVar9 = 0;
LAB_0010a9a1:
                if (uVar13 != uVar9) {
                  local_68[(int)uVar9].x0 = fVar28;
                  local_68[(int)uVar9].y0 = fVar30;
                  local_68[(int)uVar9].x1 = (float)local_308;
                  local_68[(int)uVar9].y1 = (float)local_308._4_4_;
                  local_68[(int)uVar9].invert = local_300;
                }
                uVar13 = uVar13 + 1;
                lVar11 = lVar11 + 1;
                psVar20 = psVar20 + 1;
              } while (uVar13 != uVar2);
            }
            local_98 = (undefined1  [8])0x0;
            uVar13 = (ulong)(int)*(uint *)&psVar14->next;
            if (0x40 < (long)uVar13) {
              pfVar3 = (float *)malloc((ulong)*(uint *)&psVar14->next * 8 + 4);
            }
            iVar19 = *(int *)((long)&psVar14->next + 4);
            local_68[(int)uVar2].y0 = (float)((int)local_b0 + iVar19) + 1.0;
            if (0 < iVar19) {
              local_d4 = (float)(int)local_74;
              local_b8 = pfVar3 + uVar13;
              local_f0 = local_b8 + 1;
              local_6c = 0;
              local_c8 = (undefined8 *)0x0;
              local_5c = 0;
              psVar14 = (stbtt__active_edge *)0x0;
              uVar7 = local_b0;
              auVar18 = (undefined1  [8])(stbtt__active_edge *)0x0;
              psVar20 = local_68;
              local_50 = pfVar3;
              do {
                local_3c = (float)(int)uVar7;
                y0 = local_3c + 1.0;
                iVar19 = (int)uVar13;
                local_b0 = uVar7;
                local_58 = psVar14;
                memset(pfVar3,0,(long)iVar19 * 4);
                memset(local_b8,0,(long)iVar19 * 4 + 4);
                fVar28 = local_3c;
                psVar14 = local_58;
                if (auVar18 != (undefined1  [8])0x0) {
                  psVar4 = (stbtt__active_edge *)local_98;
                  do {
                    psVar5 = (stbtt__active_edge *)auVar18;
                    if (((stbtt__active_edge *)auVar18)->ey <= fVar28) {
                      psVar4->next = ((stbtt__active_edge *)auVar18)->next;
                      if ((((stbtt__active_edge *)auVar18)->direction == 0.0) &&
                         (!NAN(((stbtt__active_edge *)auVar18)->direction))) {
                        __assert_fail("z->direction",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                      ,0x843,
                                      "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                     );
                      }
                      ((stbtt__active_edge *)auVar18)->direction = 0.0;
                      ((stbtt__active_edge *)auVar18)->next = psVar14;
                      psVar5 = psVar4;
                      psVar14 = (stbtt__active_edge *)auVar18;
                    }
                    auVar18 = (undefined1  [8])psVar5->next;
                    psVar4 = psVar5;
                  } while (auVar18 != (undefined1  [8])0x0);
                }
                fVar30 = psVar20->y0;
                puVar17 = local_c8;
                puVar6 = local_c8;
                psVar4 = psVar14;
                if (fVar30 <= y0) {
                  do {
                    fVar29 = psVar20->y1;
                    puVar6 = puVar17;
                    if ((fVar30 != fVar29) || (psVar14 = psVar4, NAN(fVar30) || NAN(fVar29))) {
                      if (psVar4 == (stbtt__active_edge *)0x0) {
                        if (local_5c == 0) {
                          local_48 = (float *)CONCAT44(local_48._4_4_,fVar30);
                          local_40 = fVar29;
                          puVar6 = (undefined8 *)malloc(0x6408);
                          if (puVar6 == (undefined8 *)0x0) goto LAB_0010b454;
                          *puVar6 = puVar17;
                          psVar4 = (stbtt__active_edge *)(puVar6 + 0xc7c);
                          local_5c = 799;
                          psVar14 = (stbtt__active_edge *)0x0;
                          fVar30 = (float)local_48;
                          fVar28 = local_3c;
                          fVar29 = local_40;
                        }
                        else {
                          if (puVar17 == (undefined8 *)0x0) {
LAB_0010b454:
                            __assert_fail("z != __null",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                          ,0x6b2,
                                          "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                         );
                          }
                          lVar11 = (long)local_5c;
                          local_5c = local_5c + -1;
                          psVar4 = (stbtt__active_edge *)(puVar17 + lVar11 * 4 + -4);
                          psVar14 = (stbtt__active_edge *)0x0;
                        }
                      }
                      else {
                        psVar14 = psVar4->next;
                      }
                      fVar33 = psVar20->x0;
                      fVar31 = (psVar20->x1 - fVar33) / (fVar29 - fVar30);
                      psVar4->fdx = fVar31;
                      psVar4->fdy = (float)(-(uint)(fVar31 != 0.0) & (uint)(1.0 / fVar31));
                      psVar4->fx = ((fVar28 - fVar30) * fVar31 + fVar33) - local_d4;
                      psVar4->direction =
                           *(float *)(&DAT_00111250 + (ulong)(psVar20->invert == 0) * 4);
                      psVar4->sy = fVar30;
                      psVar4->ey = fVar29;
                      psVar4->next = (stbtt__active_edge *)0x0;
                      if (fVar29 < fVar28) {
                        __assert_fail("z->ey >= scan_y_top",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                      ,0x850,
                                      "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                     );
                      }
                      psVar4->next = (stbtt__active_edge *)local_98;
                      local_98 = (undefined1  [8])psVar4;
                    }
                    fVar30 = psVar20[1].y0;
                    psVar20 = psVar20 + 1;
                    puVar17 = puVar6;
                    psVar4 = psVar14;
                  } while (fVar30 <= y0);
                }
                local_c8 = puVar6;
                if (local_98 != (undefined1  [8])0x0) {
                  local_70 = (float)iVar19;
                  local_f8 = psVar20;
                  local_58 = psVar14;
                  auVar18 = local_98;
                  do {
                    fVar30 = ((stbtt__active_edge *)auVar18)->ey;
                    if (fVar30 < fVar28) {
                      __assert_fail("e->ey >= y_top",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                    ,0x786,
                                    "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                   );
                    }
                    fVar29 = ((stbtt__active_edge *)auVar18)->fx;
                    fVar33 = ((stbtt__active_edge *)auVar18)->fdx;
                    if ((fVar33 != 0.0) || (NAN(fVar33))) {
                      fVar31 = ((stbtt__active_edge *)auVar18)->sy;
                      if (y0 < fVar31) {
                        __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                      ,0x799,
                                      "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                     );
                      }
                      fVar36 = fVar33 + fVar29;
                      fVar32 = (float)(~-(uint)(fVar28 < fVar31) & (uint)fVar29 |
                                      (uint)((fVar31 - fVar28) * fVar33 + fVar29) &
                                      -(uint)(fVar28 < fVar31));
                      if ((((fVar32 < 0.0) ||
                           (fVar35 = (float)(~-(uint)(fVar30 < y0) & (uint)fVar36 |
                                            (uint)((fVar30 - fVar28) * fVar33 + fVar29) &
                                            -(uint)(fVar30 < y0)), fVar35 < 0.0)) ||
                          (local_70 <= fVar32)) || (local_70 <= fVar35)) {
                        if (0 < iVar19) {
                          local_e8 = ZEXT416((uint)fVar29);
                          local_a8 = ZEXT416((uint)fVar36);
                          local_74 = fVar33;
                          iVar27 = 0;
                          do {
                            pfVar3 = local_50;
                            local_40 = (float)iVar27;
                            iVar26 = iVar27 + 1;
                            fVar33 = (float)iVar26;
                            fVar30 = (local_40 - fVar29) / local_74 + fVar28;
                            fVar31 = (fVar33 - fVar29) / local_74 + fVar28;
                            local_48 = (float *)CONCAT44(local_48._4_4_,fVar30);
                            if ((local_40 <= fVar29) || (fVar36 <= fVar33)) {
                              if ((fVar36 < local_40) && (fVar33 < fVar29)) {
                                local_88 = fVar33;
                                local_38 = fVar31;
                                stbtt__handle_clipped_edge
                                          (local_50,iVar27,(stbtt__active_edge *)auVar18,fVar29,
                                           fVar28,fVar33,fVar31);
                                fVar29 = local_88;
                                fVar28 = local_38;
                                fVar30 = (float)local_48;
LAB_0010aff6:
                                stbtt__handle_clipped_edge
                                          (pfVar3,iVar27,(stbtt__active_edge *)auVar18,fVar29,fVar28
                                           ,local_40,fVar30);
                                fVar29 = local_40;
                                fVar28 = (float)local_48;
                                goto LAB_0010b012;
                              }
                              if (((fVar29 < local_40) && (local_40 < fVar36)) ||
                                 ((fVar36 < local_40 && (local_40 < fVar29)))) goto LAB_0010aff6;
                              if (((fVar29 < fVar33) && (fVar33 < fVar36)) ||
                                 ((fVar36 < fVar33 && (fVar33 < fVar29)))) goto LAB_0010af50;
                            }
                            else {
                              local_88 = fVar33;
                              local_38 = fVar31;
                              stbtt__handle_clipped_edge
                                        (local_50,iVar27,(stbtt__active_edge *)auVar18,fVar29,fVar28
                                         ,local_40,fVar30);
                              fVar29 = local_40;
                              fVar28 = (float)local_48;
                              fVar33 = local_88;
                              fVar31 = local_38;
LAB_0010af50:
                              local_38 = fVar31;
                              local_88 = fVar33;
                              stbtt__handle_clipped_edge
                                        (pfVar3,iVar27,(stbtt__active_edge *)auVar18,fVar29,fVar28,
                                         local_88,local_38);
                              fVar29 = local_88;
                              fVar28 = local_38;
LAB_0010b012:
                              psVar14 = local_58;
                              fVar36 = (float)local_a8._0_4_;
                            }
                            stbtt__handle_clipped_edge
                                      (pfVar3,iVar27,(stbtt__active_edge *)auVar18,fVar29,fVar28,
                                       fVar36,y0);
                            fVar29 = (float)local_e8._0_4_;
                            fVar36 = (float)local_a8._0_4_;
                            fVar28 = local_3c;
                            iVar27 = iVar26;
                          } while (iVar19 != iVar26);
                        }
                      }
                      else {
                        if (fVar31 <= fVar28) {
                          fVar31 = fVar28;
                        }
                        uVar2 = (uint)fVar32;
                        if (y0 <= fVar30) {
                          fVar30 = y0;
                        }
                        uVar9 = (uint)fVar35;
                        if (uVar2 == uVar9) {
                          if (((int)uVar2 < 0) || (iVar19 <= (int)uVar2)) {
                            __assert_fail("x >= 0 && x < len",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                          ,0x7b5,
                                          "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                         );
                          }
                          fVar29 = ((stbtt__active_edge *)auVar18)->direction;
                          uVar13 = (ulong)uVar2;
                          local_50[uVar13] =
                               (((fVar35 - (float)(int)uVar2) + (fVar32 - (float)(int)uVar2)) * -0.5
                               + 1.0) * fVar29 * (fVar30 - fVar31) + local_50[uVar13];
                          fVar29 = (fVar30 - fVar31) * fVar29;
                        }
                        else {
                          fVar33 = ((stbtt__active_edge *)auVar18)->fdy;
                          fVar34 = fVar35;
                          uVar10 = uVar2;
                          if (fVar35 < fVar32) {
                            fVar29 = fVar28 - fVar31;
                            fVar31 = (fVar28 - fVar30) + y0;
                            fVar33 = -fVar33;
                            fVar30 = fVar29 + y0;
                            fVar34 = fVar32;
                            fVar29 = fVar36;
                            uVar10 = uVar9;
                            uVar9 = uVar2;
                            fVar32 = fVar35;
                          }
                          iVar27 = uVar10 + 1;
                          fVar35 = ((float)iVar27 - fVar29) * fVar33 + fVar28;
                          fVar29 = ((stbtt__active_edge *)auVar18)->direction;
                          fVar36 = (fVar35 - fVar31) * fVar29;
                          lVar11 = (long)(int)uVar10;
                          local_50[lVar11] =
                               (((fVar32 - (float)(int)uVar10) + 1.0) * -0.5 + 1.0) * fVar36 +
                               local_50[lVar11];
                          if (uVar9 - iVar27 != 0 && iVar27 <= (int)uVar9) {
                            do {
                              local_50[lVar11 + 1] =
                                   fVar33 * fVar29 * 0.5 + fVar36 + local_50[lVar11 + 1];
                              fVar36 = fVar36 + fVar33 * fVar29;
                              lVar11 = lVar11 + 1;
                            } while (uVar9 - 1 != (int)lVar11);
                          }
                          if (1.01 < ABS(fVar36)) {
                            __assert_fail("fabs(area) <= 1.01f",
                                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                                          ,0x7da,
                                          "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                         );
                          }
                          uVar13 = (ulong)(int)uVar9;
                          local_50[uVar13] =
                               (fVar30 - (fVar33 * (float)(int)(uVar9 - iVar27) + fVar35)) *
                               (((fVar34 - (float)(int)uVar9) + 0.0) * -0.5 + 1.0) * fVar29 + fVar36
                               + local_50[uVar13];
                          fVar29 = (fVar30 - fVar31) * fVar29;
                        }
                        local_f0[uVar13] = fVar29 + local_f0[uVar13];
                      }
                    }
                    else if (fVar29 < local_70) {
                      if (0.0 <= fVar29) {
                        local_e8 = ZEXT416((uint)fVar29);
                        stbtt__handle_clipped_edge
                                  (local_50,(int)fVar29,(stbtt__active_edge *)auVar18,fVar29,fVar28,
                                   fVar29,y0);
                        iVar27 = (int)fVar29 + 1;
                        fVar28 = local_3c;
                        fVar29 = (float)local_e8._0_4_;
                      }
                      else {
                        iVar27 = 0;
                      }
                      stbtt__handle_clipped_edge
                                (local_b8,iVar27,(stbtt__active_edge *)auVar18,fVar29,fVar28,fVar29,
                                 y0);
                      fVar28 = local_3c;
                    }
                    auVar18 = (undefined1  [8])((stbtt__active_edge *)auVar18)->next;
                  } while (auVar18 != (undefined1  [8])0x0);
                  uVar13 = (ulong)*(uint *)&active->next;
                  pfVar3 = local_50;
                  psVar20 = local_f8;
                }
                psVar21 = local_d0;
                auVar18 = local_98;
                if (0 < (int)uVar13) {
                  fVar28 = 0.0;
                  lVar11 = 0;
                  do {
                    fVar28 = fVar28 + local_b8[lVar11];
                    iVar19 = (int)(ABS(pfVar3[lVar11] + fVar28) * 255.0 + 0.5);
                    uVar15 = (undefined1)iVar19;
                    if (0xfe < iVar19) {
                      uVar15 = 0xff;
                    }
                    *(undefined1 *)
                     (lVar11 + (long)(int)active->fx * (long)local_6c + *(long *)&active->fdy) =
                         uVar15;
                    lVar11 = lVar11 + 1;
                    uVar13 = (ulong)*(int *)&active->next;
                  } while (lVar11 < (long)uVar13);
                }
                for (; auVar18 != (undefined1  [8])0x0;
                    auVar18 = (undefined1  [8])((stbtt__active_edge *)auVar18)->next) {
                  ((stbtt__active_edge *)auVar18)->fx =
                       ((stbtt__active_edge *)auVar18)->fdx + ((stbtt__active_edge *)auVar18)->fx;
                }
                uVar7 = (ulong)((int)local_b0 + 1);
                local_6c = local_6c + 1;
                auVar18 = local_98;
                puVar17 = local_c8;
              } while (local_6c < *(int *)((long)&active->next + 4));
              while (puVar17 != (undefined8 *)0x0) {
                puVar6 = (undefined8 *)*puVar17;
                free(puVar17);
                puVar17 = puVar6;
              }
            }
            if (pfVar3 != (float *)&local_308) {
              free(pfVar3);
            }
            free(local_68);
          }
          free(psVar21);
          psVar21 = local_c0;
LAB_0010b3c1:
          free(psVar21);
        }
      }
    }
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_Rasterize(stbtt__bitmap *result, float flatness_in_pixels, stbtt_vertex *vertices, int num_verts, float scale_x, float scale_y, float shift_x, float shift_y, int x_off, int y_off, int invert, void *userdata)
{
   float scale = scale_x > scale_y ? scale_y : scale_x;
   int winding_count, *winding_lengths;
   stbtt__point *windings = stbtt_FlattenCurves(vertices, num_verts, flatness_in_pixels / scale, &winding_lengths, &winding_count, userdata);
   if (windings) {
      stbtt__rasterize(result, windings, winding_lengths, winding_count, scale_x, scale_y, shift_x, shift_y, x_off, y_off, invert, userdata);
      STBTT_free(winding_lengths, userdata);
      STBTT_free(windings, userdata);
   }
}